

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::LiteTest_DynamicCastMessageInvalidReferenceType_Test::TestBody
          (LiteTest_DynamicCastMessageInvalidReferenceType_Test *this)

{
  bool bVar1;
  MessageLite *from;
  CastType1 test_type_1;
  AssertHelper AStack_3a8;
  long *local_3a0;
  char *local_398;
  long local_390 [2];
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_380 [4];
  TestAllTypesLite local_360;
  
  from = (MessageLite *)0x0;
  proto2_unittest::TestAllTypesLite::TestAllTypesLite(&local_360,(Arena *)0x0);
  local_390[0] = 0;
  local_390[1] = 0;
  local_398 = (char *)0x0;
  local_3a0 = local_390;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    DynamicCastMessage<proto2_unittest::TestPackedTypesLite>((protobuf *)&local_360,from);
  }
  std::__cxx11::string::_M_replace((ulong)&local_3a0,0,local_398,0x2a4afd);
  testing::Message::Message((Message *)local_380);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_3a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
             ,0x57b,(char *)local_3a0);
  testing::internal::AssertHelper::operator=(&AStack_3a8,(Message *)local_380);
  testing::internal::AssertHelper::~AssertHelper(&AStack_3a8);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_380[0]._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_380[0]._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  if (local_3a0 != local_390) {
    operator_delete(local_3a0,local_390[0] + 1);
  }
  proto2_unittest::TestAllTypesLite::~TestAllTypesLite(&local_360);
  return;
}

Assistant:

TEST(LiteTest, DynamicCastMessageInvalidReferenceType) {
  CastType1 test_type_1;
  const MessageLite& test_type_1_pointer_const_ref = test_type_1;
#if defined(ABSL_HAVE_EXCEPTIONS)
  EXPECT_THROW(DynamicCastMessage<CastType2>(test_type_1_pointer_const_ref),
               std::bad_cast);
#elif defined(GTEST_HAS_DEATH_TEST)
  ASSERT_DEATH(
      DynamicCastMessage<CastType2>(test_type_1_pointer_const_ref),
      absl::StrCat("Cannot downcast ", test_type_1.GetTypeName(), " to ",
                   CastType2::default_instance().GetTypeName()));
#else
  (void)test_type_1;
  (void)test_type_1_pointer_const_ref;
  GTEST_SKIP() << "Can't test the failure.";
#endif
}